

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_dictContentType_e dictContentType;
  void *pvVar1;
  void *dict;
  void *pvVar2;
  unsigned_long_long uVar3;
  ZSTD_paramSwitch_e ZVar4;
  ZSTD_customMem customMem;
  ZSTD_customMem cMem;
  ZSTD_CCtx_params params;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  ZSTD_CDict *pZVar9;
  ulong uVar10;
  ZSTDMT_CCtx *pZVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  ZSTD_CCtx_params *pZVar15;
  undefined8 *puVar16;
  ZSTD_cParamMode_e mode;
  ulong pledgedSrcSize;
  byte bVar17;
  undefined1 auVar18 [16];
  ZSTD_allocFunction in_stack_fffffffffffffe08;
  ZSTD_freeFunction in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined1 auVar19 [12];
  undefined1 auVar20 [24];
  undefined1 auVar21 [24];
  undefined1 in_stack_fffffffffffffe20 [184];
  ZSTD_CCtx_params local_120;
  ZSTD_compressionParameters local_4c;
  
  bVar17 = 0;
  memcpy(&local_120,&cctx->requestedParams,0xd0);
  pvVar1 = (cctx->localDict).dict;
  dict = (cctx->prefixDict).dict;
  sVar13 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  if (pvVar1 == (void *)0x0) {
    if ((cctx->localDict).dictBuffer != (void *)0x0) {
      __assert_fail("dl->dictBuffer == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5595,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("dl->cdict == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5596,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).dictSize != 0) {
      __assert_fail("dl->dictSize == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5597,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
  }
  else {
    pZVar9 = (cctx->localDict).cdict;
    if (pZVar9 == (ZSTD_CDict *)0x0) {
      sVar12 = (cctx->localDict).dictSize;
      if (sVar12 == 0) {
        __assert_fail("dl->dictSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x559f,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      if (cctx->cdict != (ZSTD_CDict *)0x0) {
        __assert_fail("cctx->cdict == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x55a0,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      if (dict != (void *)0x0) {
        __assert_fail("cctx->prefixDict.dict == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x55a1,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      pvVar2 = (cctx->customMem).opaque;
      in_stack_fffffffffffffe18 = SUB84(pvVar2,0);
      in_stack_fffffffffffffe1c = (undefined4)((ulong)pvVar2 >> 0x20);
      in_stack_fffffffffffffe08 = (cctx->customMem).customAlloc;
      in_stack_fffffffffffffe10 = (cctx->customMem).customFree;
      customMem.opaque._4_4_ = in_stack_fffffffffffffe1c;
      customMem._0_20_ = *(undefined1 (*) [20])&cctx->customMem;
      pZVar9 = ZSTD_createCDict_advanced2
                         (pvVar1,sVar12,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,
                          &cctx->requestedParams,customMem);
      (cctx->localDict).cdict = pZVar9;
      if (pZVar9 == (ZSTD_CDict *)0x0) {
        uVar10 = 0xffffffffffffffc0;
      }
      else {
        cctx->cdict = pZVar9;
        uVar10 = 0;
      }
      bVar7 = pZVar9 != (ZSTD_CDict *)0x0;
      goto LAB_0016fdb9;
    }
    if (cctx->cdict != pZVar9) {
      __assert_fail("cctx->cdict == dl->cdict",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x559c,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
  }
  bVar7 = true;
  uVar10 = 0;
LAB_0016fdb9:
  if (bVar7) {
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    if ((dict != (void *)0x0) && (cctx->cdict != (ZSTD_CDict *)0x0)) {
      __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6898,
                    "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)")
      ;
    }
    pZVar9 = cctx->cdict;
    if ((pZVar9 != (ZSTD_CDict *)0x0) && ((cctx->localDict).cdict == (ZSTD_CDict *)0x0)) {
      local_120.compressionLevel = pZVar9->compressionLevel;
    }
    if (endOp == ZSTD_e_end) {
      cctx->pledgedSrcSizePlusOne = inSize + 1;
    }
    sVar12 = sVar13;
    if (dict == (void *)0x0) {
      sVar12 = 0;
    }
    if (dict == (void *)0x0 && pZVar9 != (ZSTD_CDict *)0x0) {
      sVar12 = pZVar9->dictContentSize;
    }
    uVar10 = cctx->pledgedSrcSizePlusOne - 1;
    if ((pZVar9 == (ZSTD_CDict *)0x0) ||
       ((mode = ZSTD_cpm_attachDict, (pZVar9->matchState).dedicatedDictSearch == 0 &&
        ((((local_120.attachDictPref != ZSTD_dictForceAttach && cctx->pledgedSrcSizePlusOne != 0) &&
           attachDictSizeCutoffs[(pZVar9->matchState).cParams.strategy] < uVar10 ||
          (local_120.attachDictPref == ZSTD_dictForceCopy)) || (local_120.forceWindow != 0)))))) {
      mode = ZSTD_cpm_noAttachDict;
    }
    ZSTD_getCParamsFromCCtxParams(&local_4c,&local_120,uVar10,sVar12,mode);
    local_120.cParams.targetLength = local_4c.targetLength;
    local_120.cParams.strategy = local_4c.strategy;
    uVar6 = local_120.cParams._20_8_;
    local_120.cParams.windowLog = local_4c.windowLog;
    local_120.cParams.chainLog = local_4c.chainLog;
    uVar5 = local_120.cParams._0_8_;
    local_120.cParams.strategy = local_4c.strategy;
    local_120.cParams.windowLog = local_4c.windowLog;
    if ((local_120.useBlockSplitter == ZSTD_ps_auto) &&
       (local_120.useBlockSplitter = ZSTD_ps_disable, ZSTD_btlazy2 < local_120.cParams.strategy)) {
      local_120.useBlockSplitter = (local_120.cParams.windowLog < 0x11) + ZSTD_ps_enable;
    }
    if ((local_120.ldmParams.enableLdm == ZSTD_ps_auto) &&
       (local_120.ldmParams.enableLdm = ZSTD_ps_disable, ZSTD_btlazy2 < local_120.cParams.strategy))
    {
      local_120.ldmParams.enableLdm = (local_120.cParams.windowLog < 0x1b) + ZSTD_ps_enable;
    }
    if ((local_120.useRowMatchFinder == ZSTD_ps_auto) &&
       (local_120.useRowMatchFinder = ZSTD_ps_disable,
       0xfffffffc < local_120.cParams.strategy - ZSTD_btlazy2)) {
      local_120.useRowMatchFinder = (local_120.cParams.windowLog < 0xf) + ZSTD_ps_enable;
    }
    sVar12 = 0x20000;
    if (local_120.maxBlockSize != 0) {
      sVar12 = local_120.maxBlockSize;
    }
    local_120.maxBlockSize = sVar12;
    uVar10 = (ulong)local_120.searchForExternalRepcodes;
    ZVar4 = (local_120.compressionLevel < 10) + ZSTD_ps_enable;
    if (local_120.searchForExternalRepcodes != ZSTD_ps_auto) {
      ZVar4 = local_120.searchForExternalRepcodes;
    }
    local_120.searchForExternalRepcodes = ZVar4;
    if ((local_120.useSequenceProducer != 1) ||
       (uVar10 = 0xffffffffffffffd7, local_120.nbWorkers < 1)) {
      pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
      if (pledgedSrcSize < 0x80001) {
        local_120.nbWorkers = 0;
      }
      local_120.cParams._0_8_ = uVar5;
      local_120.cParams._20_8_ = uVar6;
      if (local_120.nbWorkers < 1) {
        local_120.cParams.chainLog = local_4c.chainLog;
        auVar18._0_4_ = -(uint)(0x7fffffe9 < (int)(local_120.cParams.windowLog - 0x20 ^ 0x80000000))
        ;
        auVar18._4_4_ = -(uint)(0x7fffffe6 < (int)(local_120.cParams.chainLog - 0x1f ^ 0x80000000));
        auVar18._8_4_ = -(uint)(0x7fffffe6 < (int)(local_4c.hashLog - 0x1f ^ 0x80000000));
        auVar18._12_4_ = -(uint)(0x7fffffe1 < (int)(local_4c.searchLog - 0x1f ^ 0x80000000));
        iVar8 = movmskps((int)uVar10,auVar18);
        if ((((iVar8 != 0xf) || (4 < local_4c.minMatch - 3)) ||
            (local_120.cParams.targetLength = local_4c.targetLength,
            0x20000 < local_120.cParams.targetLength)) ||
           (8 < local_120.cParams.strategy - ZSTD_fast)) {
          __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x68d8,
                        "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                       );
        }
        sVar13 = ZSTD_compressBegin_internal
                           (cctx,dict,sVar13,dictContentType,ZSTD_dtlm_fast,cctx->cdict,&local_120,
                            pledgedSrcSize,ZSTDb_buffered);
        if (0xffffffffffffff88 < sVar13) {
          return sVar13;
        }
        if ((cctx->appliedParams).nbWorkers != 0) {
          __assert_fail("cctx->appliedParams.nbWorkers == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x68de,
                        "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                       );
        }
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
          sVar13 = (ulong)(cctx->blockSize == pledgedSrcSize) + cctx->blockSize;
        }
        else {
          sVar13 = 0;
        }
        cctx->inBuffTarget = sVar13;
        cctx->outBuffContentSize = 0;
        cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
      }
      else {
        if (cctx->mtctx == (ZSTDMT_CCtx *)0x0) {
          pvVar1 = (cctx->customMem).opaque;
          in_stack_fffffffffffffe18 = SUB84(pvVar1,0);
          in_stack_fffffffffffffe1c = (undefined4)((ulong)pvVar1 >> 0x20);
          in_stack_fffffffffffffe08 = (cctx->customMem).customAlloc;
          in_stack_fffffffffffffe10 = (cctx->customMem).customFree;
          cMem.opaque._4_4_ = in_stack_fffffffffffffe1c;
          cMem._0_20_ = *(undefined1 (*) [20])&cctx->customMem;
          pZVar11 = ZSTDMT_createCCtx_advanced(local_120.nbWorkers,cMem,cctx->pool);
          cctx->mtctx = pZVar11;
          if (pZVar11 == (ZSTDMT_CCtx *)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        pZVar11 = cctx->mtctx;
        pZVar9 = cctx->cdict;
        uVar3 = cctx->pledgedSrcSizePlusOne;
        pZVar15 = &local_120;
        puVar16 = (undefined8 *)&stack0xfffffffffffffe08;
        for (lVar14 = 0x1a; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar16 = *(undefined8 *)pZVar15;
          pZVar15 = (ZSTD_CCtx_params *)((long)pZVar15 + ((ulong)bVar17 * -2 + 1) * 8);
          puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
        }
        params.cParams._4_8_ = in_stack_fffffffffffffe10;
        params._0_8_ = in_stack_fffffffffffffe08;
        params.cParams.searchLog = in_stack_fffffffffffffe18;
        params.cParams.minMatch = in_stack_fffffffffffffe1c;
        auVar19 = in_stack_fffffffffffffe20._8_12_;
        auVar20 = in_stack_fffffffffffffe20._72_24_;
        auVar21 = in_stack_fffffffffffffe20._128_24_;
        params.cParams.targetLength = in_stack_fffffffffffffe20._0_4_;
        params.cParams.strategy = in_stack_fffffffffffffe20._4_4_;
        params.fParams.contentSizeFlag = auVar19._0_4_;
        params.fParams.checksumFlag = auVar19._4_4_;
        params.fParams.noDictIDFlag = auVar19._8_4_;
        params.compressionLevel = in_stack_fffffffffffffe20._20_4_;
        params.forceWindow = in_stack_fffffffffffffe20._24_4_;
        params._52_4_ = in_stack_fffffffffffffe20._28_4_;
        params.targetCBlockSize = in_stack_fffffffffffffe20._32_8_;
        params.srcSizeHint = in_stack_fffffffffffffe20._40_4_;
        params.attachDictPref = in_stack_fffffffffffffe20._44_4_;
        params.literalCompressionMode = in_stack_fffffffffffffe20._48_4_;
        params.nbWorkers = in_stack_fffffffffffffe20._52_4_;
        params.jobSize = in_stack_fffffffffffffe20._56_8_;
        params.overlapLog = in_stack_fffffffffffffe20._64_4_;
        params.rsyncable = in_stack_fffffffffffffe20._68_4_;
        params.ldmParams.enableLdm = auVar20._0_4_;
        params.ldmParams.hashLog = auVar20._4_4_;
        params.ldmParams.bucketSizeLog = auVar20._8_4_;
        params.ldmParams.minMatchLength = auVar20._12_4_;
        params.ldmParams.hashRateLog = auVar20._16_4_;
        params.ldmParams.windowLog = auVar20._20_4_;
        params.enableDedicatedDictSearch = in_stack_fffffffffffffe20._96_4_;
        params.inBufferMode = in_stack_fffffffffffffe20._100_4_;
        params.outBufferMode = in_stack_fffffffffffffe20._104_4_;
        params.blockDelimiters = in_stack_fffffffffffffe20._108_4_;
        params.validateSequences = in_stack_fffffffffffffe20._112_4_;
        params.useBlockSplitter = in_stack_fffffffffffffe20._116_4_;
        params.useRowMatchFinder = in_stack_fffffffffffffe20._120_4_;
        params.deterministicRefPrefix = in_stack_fffffffffffffe20._124_4_;
        params.customMem.customAlloc = (ZSTD_allocFunction)auVar21._0_8_;
        params.customMem.customFree = (ZSTD_freeFunction)auVar21._8_8_;
        params.customMem.opaque = (void *)auVar21._16_8_;
        params.prefetchCDictTables = in_stack_fffffffffffffe20._152_4_;
        params.enableMatchFinderFallback = in_stack_fffffffffffffe20._156_4_;
        params.useSequenceProducer = in_stack_fffffffffffffe20._160_4_;
        params._188_4_ = in_stack_fffffffffffffe20._164_4_;
        params.maxBlockSize = in_stack_fffffffffffffe20._168_8_;
        params.searchForExternalRepcodes = in_stack_fffffffffffffe20._176_4_;
        params._204_4_ = in_stack_fffffffffffffe20._180_4_;
        sVar12 = ZSTDMT_initCStream_internal
                           (pZVar11,dict,sVar13,dictContentType,pZVar9,params,uVar3 - 1);
        if (0xffffffffffffff88 < sVar12) {
          return sVar12;
        }
        pZVar9 = cctx->cdict;
        if (pZVar9 == (ZSTD_CDict *)0x0) {
          cctx->dictID = 0;
        }
        else {
          cctx->dictID = pZVar9->dictID;
          sVar13 = pZVar9->dictContentSize;
        }
        cctx->dictContentSize = sVar13;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        memcpy(&cctx->appliedParams,&local_120,0xd0);
      }
      uVar10 = 0;
    }
  }
  return uVar10;
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}